

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

void __thiscall
capnp::_::(anonymous_namespace)::MembranePolicyImpl::~MembranePolicyImpl(MembranePolicyImpl *this)

{
  long *plVar1;
  
  *(undefined ***)(this + -8) = &PTR_inboundCall_0062e1c8;
  *(undefined ***)this = &PTR_disposeImpl_0062e230;
  if ((this[0x10] == (MembranePolicyImpl)0x1) &&
     (plVar1 = *(long **)(this + 0x20), plVar1 != (long *)0x0)) {
    *(undefined8 *)(this + 0x20) = 0;
    (**(code **)**(undefined8 **)(this + 0x18))
              (*(undefined8 **)(this + 0x18),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  kj::Refcounted::~Refcounted((Refcounted *)this);
  operator_delete(this + -8,0x30);
  return;
}

Assistant:

MembranePolicyImpl() = default;